

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_bitmap_remove_checked(roaring64_bitmap_t *r,uint64_t val)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  art_val_t *leaf;
  ulong uVar4;
  run_container_t *prVar5;
  _Bool _Var6;
  uint8_t high48 [6];
  uint local_28;
  ushort local_24;
  undefined2 uStack_22;
  
  uStack_22 = (undefined2)((ulong)in_RAX >> 0x30);
  _local_28 = CONCAT24((ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00,
                       (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
                       (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000);
  leaf = art_find(&r->art,(art_key_chunk_t *)&local_28);
  if (leaf == (art_val_t *)0x0) {
    _Var6 = false;
  }
  else {
    uVar4 = *leaf;
    prVar5 = (run_container_t *)r->containers[uVar4 >> 8];
    if ((char)uVar4 == '\x04') {
      uVar4 = (ulong)*(byte *)&prVar5->runs;
      prVar5 = *(run_container_t **)prVar5;
    }
    if ((char)uVar4 == '\x03') {
      iVar2 = run_container_cardinality(prVar5);
    }
    else {
      iVar2 = prVar5->n_runs;
    }
    _Var1 = containerptr_roaring64_bitmap_remove(r,(uint8_t *)&local_28,(uint16_t)val,leaf);
    _Var6 = true;
    if (!_Var1) {
      uVar4 = *leaf;
      prVar5 = (run_container_t *)r->containers[uVar4 >> 8];
      if ((char)uVar4 == '\x04') {
        uVar4 = (ulong)*(byte *)&prVar5->runs;
        prVar5 = *(run_container_t **)prVar5;
      }
      if ((char)uVar4 == '\x03') {
        iVar3 = run_container_cardinality(prVar5);
      }
      else {
        iVar3 = prVar5->n_runs;
      }
      _Var6 = iVar3 != iVar2;
    }
  }
  return _Var6;
}

Assistant:

bool roaring64_bitmap_remove_checked(roaring64_bitmap_t *r, uint64_t val) {
    art_t *art = &r->art;
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(art, high48);

    if (leaf == NULL) {
        return false;
    }
    int old_cardinality =
        container_get_cardinality(get_container(r, *leaf), get_typecode(*leaf));
    if (containerptr_roaring64_bitmap_remove(r, high48, low16, leaf)) {
        return true;
    }
    int new_cardinality =
        container_get_cardinality(get_container(r, *leaf), get_typecode(*leaf));
    return new_cardinality != old_cardinality;
}